

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O2

void discover_object(int oindx,boolean mark_as_known,boolean credit_hero)

{
  int iVar1;
  objclass *poVar2;
  short *psVar3;
  short *psVar4;
  
  poVar2 = objects;
  if ((objects[oindx].field_0x10 & 1) != 0) {
    return;
  }
  psVar3 = disco + bases[objects[oindx].oc_class];
  do {
    psVar4 = psVar3;
    if (*psVar4 == 0) break;
    psVar3 = psVar4 + 1;
  } while (*psVar4 != oindx);
  *psVar4 = (short)oindx;
  if (mark_as_known != '\0') {
    poVar2[oindx].field_0x10 = poVar2[oindx].field_0x10 | 1;
    if (credit_hero != '\0') {
      exercise(2,'\x01');
    }
    if (oindx - 0x5fU < 0xb) {
      iVar1 = -0xb;
    }
    else {
      if (10 < oindx - 0x54U) goto LAB_001fcfe3;
      iVar1 = 0xb;
    }
    discover_object(iVar1 + oindx,mark_as_known,'\0');
  }
LAB_001fcfe3:
  if (moves < 2) {
    return;
  }
  update_inventory();
  return;
}

Assistant:

void discover_object(int oindx, boolean mark_as_known, boolean credit_hero)
{
    if (!objects[oindx].oc_name_known) {
	int dindx, acls = objects[oindx].oc_class;

	/* Loop thru disco[] 'til we find the target (which may have been
	   uname'd) or the next open slot; one or the other will be found
	   before we reach the next class...
	 */
	for (dindx = bases[acls]; disco[dindx] != 0; dindx++)
	    if (disco[dindx] == oindx) break;
	disco[dindx] = oindx;

	if (mark_as_known) {
	    objects[oindx].oc_name_known = 1;
	    if (credit_hero) exercise(A_WIS, TRUE);

	    if (Is_dragon_scales(oindx))
		discover_object(Dragon_scales_to_mail(oindx), mark_as_known, FALSE);
	    else if (Is_dragon_mail(oindx))
		discover_object(Dragon_mail_to_scales(oindx), mark_as_known, FALSE);
	}
	if (moves > 1L) update_inventory();
    }
}